

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3StrAccumFinish(StrAccum *p)

{
  char *pcVar1;
  StrAccum *p_local;
  
  if (((p->zText != (char *)0x0) && (p->zText[p->nChar] = '\0', p->useMalloc != '\0')) &&
     (p->zText == p->zBase)) {
    if (p->useMalloc == '\x01') {
      pcVar1 = (char *)sqlite3DbMallocRaw(p->db,p->nChar + 1);
      p->zText = pcVar1;
    }
    else {
      pcVar1 = (char *)sqlite3_malloc(p->nChar + 1);
      p->zText = pcVar1;
    }
    if (p->zText == (char *)0x0) {
      p->mallocFailed = '\x01';
    }
    else {
      memcpy(p->zText,p->zBase,(long)(p->nChar + 1));
    }
  }
  return p->zText;
}

Assistant:

SQLITE_PRIVATE char *sqlite3StrAccumFinish(StrAccum *p){
  if( p->zText ){
    p->zText[p->nChar] = 0;
    if( p->useMalloc && p->zText==p->zBase ){
      if( p->useMalloc==1 ){
        p->zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
      }else{
        p->zText = sqlite3_malloc(p->nChar+1);
      }
      if( p->zText ){
        memcpy(p->zText, p->zBase, p->nChar+1);
      }else{
        p->mallocFailed = 1;
      }
    }
  }
  return p->zText;
}